

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int equal_wildcard(uchar *pattern,size_t pattern_len,uchar *subject,size_t subject_len,uint flags)

{
  uchar *local_40;
  uchar *star;
  uint flags_local;
  size_t subject_len_local;
  uchar *subject_local;
  size_t pattern_len_local;
  uchar *pattern_local;
  
  local_40 = (uchar *)0x0;
  if ((subject_len < 2) || (*subject != '.')) {
    local_40 = valid_star(pattern,pattern_len,flags);
  }
  if (local_40 == (uchar *)0x0) {
    pattern_local._4_4_ = equal_nocase(pattern,pattern_len,subject,subject_len,flags);
  }
  else {
    pattern_local._4_4_ =
         wildcard_match(pattern,(long)local_40 - (long)pattern,local_40 + 1,
                        (size_t)(pattern + (pattern_len - (long)local_40) + -1),subject,subject_len,
                        flags);
  }
  return pattern_local._4_4_;
}

Assistant:

static int equal_wildcard(const unsigned char *pattern, size_t pattern_len,
                          const unsigned char *subject, size_t subject_len,
                          unsigned int flags) {
  const unsigned char *star = NULL;

  // Subject names starting with '.' can only match a wildcard pattern
  // via a subject sub-domain pattern suffix match.
  if (!(subject_len > 1 && subject[0] == '.')) {
    star = valid_star(pattern, pattern_len, flags);
  }
  if (star == NULL) {
    return equal_nocase(pattern, pattern_len, subject, subject_len, flags);
  }
  return wildcard_match(pattern, star - pattern, star + 1,
                        (pattern + pattern_len) - star - 1, subject,
                        subject_len, flags);
}